

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O3

bool __thiscall
tinyusdz::BlendShape::add_inbetweenBlendShape(BlendShape *this,double weight,Attribute *attr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  mapped_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string attr_name;
  string local_620;
  Property local_600;
  
  bVar2 = false;
  if (((attr->_name)._M_string_length != 0) && (attr->_variability != Uniform)) {
    bVar2 = Attribute::is_value(attr);
    if (bVar2) {
      paVar1 = &local_600._attrib._name.field_2;
      local_600._attrib._name._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"{}:{}","");
      fmt::format<char_const*,std::__cxx11::string>
                (&local_620,(fmt *)&local_600,(string *)&kInbetweensNamespace,(char **)attr,in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_600._attrib._name._M_dataplus._M_p != paVar1) {
        operator_delete(local_600._attrib._name._M_dataplus._M_p,
                        local_600._attrib._name.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::string::_M_assign((string *)attr);
      if ((attr->_metas).weight.has_value_ == false) {
        (attr->_metas).weight.has_value_ = true;
      }
      (attr->_metas).weight.contained = (storage_t<double>)weight;
      Property::Property(&local_600,attr,false);
      this_00 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::operator[](&this->props,&local_620);
      Property::operator=(this_00,&local_600);
      Property::~Property(&local_600);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_620._M_dataplus._M_p != &local_620.field_2) {
        operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
      }
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool BlendShape::add_inbetweenBlendShape(const double weight, Attribute &&attr) {

  if (attr.name().empty()) {
    return false;
  }

  if (attr.is_uniform()) {
    return false;
  }

  if (!attr.is_value()) {
    return false;
  }

  std::string attr_name = fmt::format("{}:{}", kInbetweensNamespace, attr.name());
  attr.set_name(attr_name);

  attr.metas().weight = weight;

  props[attr_name] = Property(attr, /* custom */false);

  return true;
}